

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

string * __thiscall
slang::CommandLine::findNearestMatch_abi_cxx11_
          (string *__return_storage_ptr__,CommandLine *this,string_view arg)

{
  int iVar1;
  size_type __n;
  _Base_ptr p_Var2;
  int maxDistance;
  _Base_ptr p_Var3;
  string_view left;
  allocator<char> local_99;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (2 < arg._M_len) {
    local_98 = arg;
    __n = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_98,'=',0);
    if (__n != 0xffffffffffffffff) {
      local_98 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&local_98,0,__n);
    }
    local_88._M_len = 0;
    local_88._M_str = (char *)0x0;
    maxDistance = 5;
    p_Var3 = (_Base_ptr)0x0;
    for (p_Var2 = (this->optionMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(this->optionMap)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      if ((**(char **)(p_Var2 + 1) != '+') &&
         (left._M_str = *(char **)(p_Var2 + 1), left._M_len = (size_t)p_Var2[1]._M_parent,
         iVar1 = editDistance(left,local_98,true,maxDistance), iVar1 < maxDistance)) {
        local_88._M_str = *(char **)(p_Var2 + 1);
        p_Var3 = p_Var2[1]._M_parent;
        local_88._M_len = (size_t)p_Var3;
        maxDistance = iVar1;
      }
    }
    if (p_Var3 != (_Base_ptr)0x0) {
      if (p_Var3 == (_Base_ptr)0x1) {
        s_abi_cxx11_(&local_50,"-",1);
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)&local_70,&local_88,&local_99);
        std::operator+(__return_storage_ptr__,&local_50,&local_70);
      }
      else {
        s_abi_cxx11_(&local_50,"--",2);
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)&local_70,&local_88,&local_99);
        std::operator+(__return_storage_ptr__,&local_50,&local_70);
      }
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string CommandLine::findNearestMatch(std::string_view arg) const {
    if (arg.length() <= 2)
        return {};

    size_t equalsIndex = arg.find_first_of('=');
    if (equalsIndex != std::string_view::npos)
        arg = arg.substr(0, equalsIndex);

    std::string_view bestName;
    int bestDistance = 5;

    for (auto& [key, value] : optionMap) {
        if (key[0] == '+')
            continue;

        int dist = editDistance(key, arg, /* allowReplacements */ true, bestDistance);
        if (dist < bestDistance) {
            bestName = key;
            bestDistance = dist;
        }
    }

    if (bestName.empty())
        return {};

    if (bestName.length() == 1)
        return "-"s + std::string(bestName);

    return "--"s + std::string(bestName);
}